

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher-chachapoly.c
# Opt level: O1

int chachapoly_get_length(chachapoly_ctx *ctx,uint *plenp,uint seqnr,uchar *cp,uint len)

{
  uint32_t uVar1;
  int iVar2;
  uchar *ptr;
  u_char buf [4];
  u_char seqbuf [8];
  u8 *local_40;
  uchar local_34 [4];
  u8 local_30 [8];
  
  iVar2 = -1;
  if (3 < len) {
    local_40 = local_30;
    _libssh2_store_u64(&local_40,(ulong)seqnr);
    iVar2 = 0;
    chacha_ivsetup(&ctx->header_ctx,local_30,(u8 *)0x0);
    chacha_encrypt_bytes(&ctx->header_ctx,cp,local_34,4);
    uVar1 = _libssh2_ntohu32(local_34);
    *plenp = uVar1;
  }
  return iVar2;
}

Assistant:

int
chachapoly_get_length(struct chachapoly_ctx *ctx, unsigned int *plenp,
                      unsigned int seqnr, const unsigned char *cp,
                      unsigned int len)
{
    u_char buf[4], seqbuf[8];
    unsigned char *ptr = NULL;

    if(len < 4)
        return -1;
    ptr = &seqbuf[0];
    _libssh2_store_u64(&ptr, seqnr);
    chacha_ivsetup(&ctx->header_ctx, seqbuf, NULL);
    chacha_encrypt_bytes(&ctx->header_ctx, cp, buf, 4);
    *plenp = _libssh2_ntohu32(buf);
    return 0;
}